

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O3

void __thiscall
DyndepParserTestUnexpectedIndent::~DyndepParserTestUnexpectedIndent
          (DyndepParserTestUnexpectedIndent *this)

{
  DyndepParserTest::~DyndepParserTest(&this->super_DyndepParserTest);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(DyndepParserTest, UnexpectedIndent) {
  const char kInput[] =
" = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unexpected indent\n", err);
}